

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldOptions::set_jstype(FieldOptions *this,FieldOptions_JSType value)

{
  if (value < (FieldOptions_JSType_JS_NUMBER|FieldOptions_JSType_JS_STRING)) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
    this->jstype_ = value;
    return;
  }
  __assert_fail("::google::protobuf::FieldOptions_JSType_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x1c97,
                "void google::protobuf::FieldOptions::set_jstype(::google::protobuf::FieldOptions_JSType)"
               );
}

Assistant:

bool FieldOptions_JSType_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}